

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int system(char *__command)

{
  __pid_t _Var1;
  __pid_t _Var2;
  char *pcStack_38;
  int pid;
  char *argv [4];
  char *string_local;
  
  pcStack_38 = "sh";
  argv[0] = "-c";
  argv[2] = (char *)0x0;
  if (__command != (char *)0x0) {
    argv[1] = __command;
    _Var1 = fork();
    if (_Var1 == 0) {
      execve("/bin/sh",&stack0xffffffffffffffc8,(char **)0x0);
    }
    else if (0 < _Var1) {
      do {
        _Var2 = wait((void *)0x0);
      } while (_Var2 != _Var1);
    }
  }
  return -1;
}

Assistant:

int system( const char * string )
{
    const char * argv[] = { "sh", "-c", NULL, NULL };
    argv[2] = string;

    if ( string != NULL )
    {
        int pid = fork();

        if ( pid == 0 )
        {
            execve( "/bin/sh", ( char * const *)argv, NULL );
        }
        else if ( pid > 0 )
        {
            while ( wait( NULL ) != pid )
            {
                /* EMPTY */
            }
        }
    }

    return -1;
}